

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tznames_impl.cpp
# Opt level: O0

void __thiscall icu_63::ZNStringPool::~ZNStringPool(ZNStringPool *this)

{
  ZNStringPoolChunk *pZVar1;
  void *in_RSI;
  ZNStringPoolChunk *nextChunk;
  ZNStringPool *this_local;
  
  if (this->fHash != (UHashtable *)0x0) {
    uhash_close_63(this->fHash);
    this->fHash = (UHashtable *)0x0;
  }
  while (this->fChunks != (ZNStringPoolChunk *)0x0) {
    pZVar1 = this->fChunks->fNext;
    if (this->fChunks != (ZNStringPoolChunk *)0x0) {
      UMemory::operator_delete((UMemory *)this->fChunks,in_RSI);
    }
    this->fChunks = pZVar1;
  }
  return;
}

Assistant:

ZNStringPool::~ZNStringPool() {
    if (fHash != NULL) {
        uhash_close(fHash);
        fHash = NULL;
    }

    while (fChunks != NULL) {
        ZNStringPoolChunk *nextChunk = fChunks->fNext;
        delete fChunks;
        fChunks = nextChunk;
    }
}